

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.h
# Opt level: O0

void Init::reflectVector<Init::DocumentFilter>
               (StringWriter *writer,string *name,
               vector<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_> *list,
               bool skipIfEmpty)

{
  bool bVar1;
  reference pDVar2;
  DocumentFilter *elem;
  iterator __end0;
  iterator __begin0;
  vector<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_> *__range2;
  bool skipIfEmpty_local;
  vector<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_> *list_local;
  string *name_local;
  StringWriter *writer_local;
  
  if ((!skipIfEmpty) ||
     (bVar1 = std::vector<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_>::empty(list),
     !bVar1)) {
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Key(writer,name);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(writer);
    __end0 = std::vector<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_>::begin(list);
    elem = (DocumentFilter *)
           std::vector<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_>::end(list);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<Init::DocumentFilter_*,_std::vector<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_>_>
                                       *)&elem), bVar1) {
      pDVar2 = __gnu_cxx::
               __normal_iterator<Init::DocumentFilter_*,_std::vector<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_>_>
               ::operator*(&__end0);
      (**(pDVar2->super_Reflectable)._vptr_Reflectable)(pDVar2,writer);
      __gnu_cxx::
      __normal_iterator<Init::DocumentFilter_*,_std::vector<Init::DocumentFilter,_std::allocator<Init::DocumentFilter>_>_>
      ::operator++(&__end0);
    }
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(writer,0);
  }
  return;
}

Assistant:

void reflectVector (StringWriter &writer, const string &name, vector<T> &list, bool skipIfEmpty = true) {
        if (skipIfEmpty && list.empty()) return;

        writer.Key(name);
        writer.StartArray();
        for (T &elem : list) {
            elem.reflect(writer);
        }
        writer.EndArray();
    }